

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.hpp
# Opt level: O1

shared_ptr<libtorrent::dht::null_observer> __thiscall
libtorrent::dht::rpc_manager::
allocate_observer<libtorrent::dht::null_observer,std::shared_ptr<libtorrent::dht::traversal_algorithm>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::digest32<160l>const&>
          (rpc_manager *this,shared_ptr<libtorrent::dht::traversal_algorithm> *args,
          basic_endpoint<boost::asio::ip::udp> *args_1,digest32<160L> *args_2)

{
  null_observer *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  node_id *in_R8;
  shared_ptr<libtorrent::dht::null_observer> sVar2;
  shared_ptr<libtorrent::dht::traversal_algorithm> local_40;
  
  this_00 = (null_observer *)allocate_observer((rpc_manager *)args);
  if (this_00 == (null_observer *)0x0) {
    (this->m_pool_allocator).super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
    (this->m_pool_allocator).list.ptr = (char *)0x0;
    _Var1._M_pi = extraout_RDX;
  }
  else {
    local_40.super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = *(element_type **)&(args_1->impl_).data_;
    local_40.super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&(args_1->impl_).data_ + 8);
    *(undefined8 *)((long)&(args_1->impl_).data_ + 8) = 0;
    *(undefined8 *)&(args_1->impl_).data_ = 0;
    null_observer::null_observer(this_00,&local_40,(endpoint *)args_2,in_R8);
    (this->m_pool_allocator).super_simple_segregated_storage<unsigned_long>.first = this_00;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libtorrent::dht::null_observer*,libtorrent::dht::rpc_manager::allocate_observer<libtorrent::dht::null_observer,std::shared_ptr<libtorrent::dht::traversal_algorithm>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::digest32<160l>const&>(std::shared_ptr<libtorrent::dht::traversal_algorithm>&&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::digest32<160l>const&)::_lambda(libtorrent::dht::observer*)_1_,std::allocator<void>,void>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->m_pool_allocator).list,this_00,
               args);
    ::std::__shared_ptr<libtorrent::dht::null_observer,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<libtorrent::dht::null_observer,libtorrent::dht::null_observer>
              ((__shared_ptr<libtorrent::dht::null_observer,(__gnu_cxx::_Lock_policy)2> *)this,
               this_00);
    _Var1._M_pi = extraout_RDX_00;
    if (local_40.
        super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.
                 super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      _Var1._M_pi = extraout_RDX_01;
    }
  }
  sVar2.super___shared_ptr<libtorrent::dht::null_observer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<libtorrent::dht::null_observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<libtorrent::dht::null_observer>)
         sVar2.super___shared_ptr<libtorrent::dht::null_observer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> allocate_observer(Args&&... args)
	{
		void* ptr = allocate_observer();
		if (ptr == nullptr) return std::shared_ptr<T>();

		auto deleter = [this](observer* o)
		{
			TORRENT_ASSERT(o->m_in_use);
			o->~observer();
			free_observer(o);
		};
		return std::shared_ptr<T>(new (ptr) T(std::forward<Args>(args)...), deleter);
	}